

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeFinalizing.cpp
# Opt level: O1

void __thiscall wasm::anon_unknown_34::TypeFinalizing::run(TypeFinalizing *this,Module *module)

{
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar1;
  undefined1 auVar2 [8];
  __hashtable *__h;
  undefined1 local_130 [8];
  optional<wasm::SubTypes> subTypes;
  long local_c8;
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_c0;
  TypeFinalizing *local_70;
  Module *local_68;
  undefined1 local_60 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> privateTypes;
  HeapType type;
  
  if (((module->features).features & 0x400) != 0) {
    subTypes.super__Optional_base<wasm::SubTypes,_false,_false>._M_payload.
    super__Optional_payload<wasm::SubTypes,_true,_false,_false>.
    super__Optional_payload_base<wasm::SubTypes>._M_payload._72_1_ = 0;
    if (this->finalize == true) {
      SubTypes::SubTypes((SubTypes *)
                         &subTypes.super__Optional_base<wasm::SubTypes,_false,_false>._M_payload.
                          super__Optional_payload<wasm::SubTypes,_true,_false,_false>.
                          super__Optional_payload_base<wasm::SubTypes>._M_engaged,module);
      std::optional<wasm::SubTypes>::operator=
                ((optional<wasm::SubTypes> *)local_130,
                 (SubTypes *)
                 &subTypes.super__Optional_base<wasm::SubTypes,_false,_false>._M_payload.
                  super__Optional_payload<wasm::SubTypes,_true,_false,_false>.
                  super__Optional_payload_base<wasm::SubTypes>._M_engaged);
      std::
      _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_c0);
      if (subTypes.super__Optional_base<wasm::SubTypes,_false,_false>._M_payload.
          super__Optional_payload<wasm::SubTypes,_true,_false,_false>.
          super__Optional_payload_base<wasm::SubTypes>._80_8_ != 0) {
        operator_delete((void *)subTypes.super__Optional_base<wasm::SubTypes,_false,_false>.
                                _M_payload.
                                super__Optional_payload<wasm::SubTypes,_true,_false,_false>.
                                super__Optional_payload_base<wasm::SubTypes>._80_8_,
                        local_c8 -
                        subTypes.super__Optional_base<wasm::SubTypes,_false,_false>._M_payload.
                        super__Optional_payload<wasm::SubTypes,_true,_false,_false>.
                        super__Optional_payload_base<wasm::SubTypes>._80_8_);
      }
    }
    local_68 = module;
    wasm::ModuleUtils::getPrivateHeapTypes
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_60,module);
    if (local_60 !=
        (undefined1  [8])
        privateTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_start) {
      auVar2 = local_60;
      do {
        privateTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)((pointer)auVar2)->id;
        if (this->finalize == true) {
          pvVar1 = SubTypes::getImmediateSubTypes
                             ((SubTypes *)local_130,
                              (HeapType)
                              privateTypes.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
          if ((pvVar1->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
              super__Vector_impl_data._M_start ==
              (pvVar1->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
              super__Vector_impl_data._M_finish) goto LAB_00b78ac8;
        }
        else {
LAB_00b78ac8:
          subTypes.super__Optional_base<wasm::SubTypes,_false,_false>._M_payload.
          super__Optional_payload<wasm::SubTypes,_true,_false,_false>.
          super__Optional_payload_base<wasm::SubTypes>._80_8_ = &this->modifiableTypes;
          std::
          _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<wasm::HeapType_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::HeapType,true>>>>
                    ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)&this->modifiableTypes,
                     &privateTypes.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     &subTypes.super__Optional_base<wasm::SubTypes,_false,_false>._M_payload.
                      super__Optional_payload<wasm::SubTypes,_true,_false,_false>.
                      super__Optional_payload_base<wasm::SubTypes>._M_engaged);
        }
        auVar2 = (undefined1  [8])((long)auVar2 + 8);
      } while (auVar2 != (undefined1  [8])
                         privateTypes.
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_start);
    }
    GlobalTypeRewriter::GlobalTypeRewriter
              ((GlobalTypeRewriter *)
               &subTypes.super__Optional_base<wasm::SubTypes,_false,_false>._M_payload.
                super__Optional_payload<wasm::SubTypes,_true,_false,_false>.
                super__Optional_payload_base<wasm::SubTypes>._M_engaged,local_68);
    subTypes.super__Optional_base<wasm::SubTypes,_false,_false>._M_payload.
    super__Optional_payload<wasm::SubTypes,_true,_false,_false>.
    super__Optional_payload_base<wasm::SubTypes>._80_8_ = &PTR__GlobalTypeRewriter_01096658;
    privateTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_70 = this;
    GlobalTypeRewriter::update
              ((GlobalTypeRewriter *)
               &subTypes.super__Optional_base<wasm::SubTypes,_false,_false>._M_payload.
                super__Optional_payload<wasm::SubTypes,_true,_false,_false>.
                super__Optional_payload_base<wasm::SubTypes>._M_engaged,
               (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &privateTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (privateTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(privateTypes.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                      -(long)privateTypes.
                             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    GlobalTypeRewriter::~GlobalTypeRewriter
              ((GlobalTypeRewriter *)
               &subTypes.super__Optional_base<wasm::SubTypes,_false,_false>._M_payload.
                super__Optional_payload<wasm::SubTypes,_true,_false,_false>.
                super__Optional_payload_base<wasm::SubTypes>._M_engaged);
    if (local_60 != (undefined1  [8])0x0) {
      operator_delete((void *)local_60,
                      (long)privateTypes.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)local_60);
    }
    if (subTypes.super__Optional_base<wasm::SubTypes,_false,_false>._M_payload.
        super__Optional_payload<wasm::SubTypes,_true,_false,_false>.
        super__Optional_payload_base<wasm::SubTypes>._M_payload._72_1_ == '\x01') {
      std::_Optional_payload_base<wasm::SubTypes>::_M_destroy
                ((_Optional_payload_base<wasm::SubTypes> *)local_130);
    }
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasGC()) {
      return;
    }

    // To make a type final, it must have no subtypes.
    std::optional<SubTypes> subTypes;
    if (finalize) {
      subTypes = SubTypes(*module);
    }

    auto privateTypes = ModuleUtils::getPrivateHeapTypes(*module);
    for (auto type : privateTypes) {
      // If we are finalizing types then we can only do that to leaf types. If
      // we are unfinalizing, we can do that unconditionally.
      if (!finalize || subTypes->getImmediateSubTypes(type).empty()) {
        modifiableTypes.insert(type);
      }
    }

    class TypeRewriter : public GlobalTypeRewriter {
      TypeFinalizing& parent;

    public:
      TypeRewriter(Module& wasm, TypeFinalizing& parent)
        : GlobalTypeRewriter(wasm), parent(parent) {}

      void modifyTypeBuilderEntry(TypeBuilder& typeBuilder,
                                  Index i,
                                  HeapType oldType) override {
        if (parent.modifiableTypes.count(oldType)) {
          typeBuilder[i].setOpen(!parent.finalize);
        }
      }
    };

    TypeRewriter(*module, *this).update();
  }